

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

void MergeRGBPlane(uint8_t *src_r,int src_stride_r,uint8_t *src_g,int src_stride_g,uint8_t *src_b,
                  int src_stride_b,uint8_t *dst_rgb,int dst_stride_rgb,int width,int height)

{
  int iVar1;
  uint in_ECX;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  _func_void_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_uint8_t_ptr_int *MergeRGBRow;
  int y;
  uint in_stack_00000018;
  code *local_38;
  int local_30;
  long local_28;
  uint local_1c;
  long local_18;
  uint local_c;
  long local_8;
  
  local_38 = MergeRGBRow_C;
  if ((int)src_g < 0) {
    src_g._0_4_ = -(int)src_g;
    _y = _y + ((int)src_g + -1) * (int)src_b;
    src_b._0_4_ = -(int)src_b;
  }
  local_1c = in_ECX;
  local_c = in_ESI;
  if ((((in_ESI == in_stack_00000018) && (in_ECX == in_stack_00000018)) &&
      (in_R9D == in_stack_00000018)) && ((int)src_b == in_stack_00000018 * 3)) {
    in_stack_00000018 = (int)src_g * in_stack_00000018;
    src_g._0_4_ = 1;
    src_b._0_4_ = 0;
    in_R9D = 0;
    local_1c = 0;
    local_c = 0;
  }
  iVar1 = libyuv::TestCpuFlag(in_R9D);
  if ((iVar1 != 0) && (local_38 = MergeRGBRow_Any_SSSE3, (in_stack_00000018 & 0xf) == 0)) {
    local_38 = MergeRGBRow_SSSE3;
  }
  local_28 = in_R8;
  local_18 = in_RDX;
  local_8 = in_RDI;
  for (local_30 = 0; local_30 < (int)src_g; local_30 = local_30 + 1) {
    (*local_38)(local_8,local_18,local_28,_y,in_stack_00000018);
    local_8 = local_8 + (int)local_c;
    local_18 = local_18 + (int)local_1c;
    local_28 = local_28 + (int)in_R9D;
    _y = _y + (int)src_b;
  }
  return;
}

Assistant:

LIBYUV_API
void MergeRGBPlane(const uint8_t* src_r,
                   int src_stride_r,
                   const uint8_t* src_g,
                   int src_stride_g,
                   const uint8_t* src_b,
                   int src_stride_b,
                   uint8_t* dst_rgb,
                   int dst_stride_rgb,
                   int width,
                   int height) {
  int y;
  void (*MergeRGBRow)(const uint8_t* src_r, const uint8_t* src_g,
                      const uint8_t* src_b, uint8_t* dst_rgb, int width) =
      MergeRGBRow_C;
  // Coalesce rows.
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    dst_rgb = dst_rgb + (height - 1) * dst_stride_rgb;
    dst_stride_rgb = -dst_stride_rgb;
  }
  // Coalesce rows.
  if (src_stride_r == width && src_stride_g == width && src_stride_b == width &&
      dst_stride_rgb == width * 3) {
    width *= height;
    height = 1;
    src_stride_r = src_stride_g = src_stride_b = dst_stride_rgb = 0;
  }
#if defined(HAS_MERGERGBROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    MergeRGBRow = MergeRGBRow_Any_SSSE3;
    if (IS_ALIGNED(width, 16)) {
      MergeRGBRow = MergeRGBRow_SSSE3;
    }
  }
#endif
#if defined(HAS_MERGERGBROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    MergeRGBRow = MergeRGBRow_Any_NEON;
    if (IS_ALIGNED(width, 16)) {
      MergeRGBRow = MergeRGBRow_NEON;
    }
  }
#endif
#if defined(HAS_MERGERGBROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    MergeRGBRow = MergeRGBRow_Any_MMI;
    if (IS_ALIGNED(width, 8)) {
      MergeRGBRow = MergeRGBRow_MMI;
    }
  }
#endif

  for (y = 0; y < height; ++y) {
    // Merge a row of U and V into a row of RGB.
    MergeRGBRow(src_r, src_g, src_b, dst_rgb, width);
    src_r += src_stride_r;
    src_g += src_stride_g;
    src_b += src_stride_b;
    dst_rgb += dst_stride_rgb;
  }
}